

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_padding.cpp
# Opt level: O3

int test_padding(int w,int h,int c,int top,int bottom,int left,int right,int type,float value,
                int per_channel_pad_data_size)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  float a;
  float extraout_XMM0_Da;
  float a_00;
  float in_XMM1_Da;
  Option opt;
  Mat m;
  void *ptr_1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  
  a = 0.0;
  m.data = (void *)0x0;
  m.refcount = (int *)0x0;
  m.elemsize = 4;
  m.elempack = 1;
  m.allocator = (Allocator *)0x0;
  m.dims = 3;
  m.w = 5;
  m.h = 7;
  m.cstep = 0x24;
  m.c = w;
  if (w != 0) {
    lVar4 = (long)w * 0x90;
    pd.params[0].type = 0;
    pd.params[0].field_1 = (anon_union_4_2_947300a4_for_anon_struct_72_3_b6d6cd30_1)0x0;
    iVar3 = posix_memalign((void **)&pd,0x10,(long)w * 0x90 + 4);
    m.data = (void *)0x0;
    if (iVar3 == 0) {
      m.data = (void *)pd.params[0]._0_8_;
    }
    m.refcount = (int *)((long)m.data + lVar4);
    *(undefined4 *)((long)m.data + lVar4) = 1;
    a = extraout_XMM0_Da;
  }
  Randomize(&m,a,in_XMM1_Da);
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,h);
  ncnn::ParamDict::set(&pd,1,c);
  ncnn::ParamDict::set(&pd,2,top);
  ncnn::ParamDict::set(&pd,3,bottom);
  ncnn::ParamDict::set(&pd,4,left);
  ncnn::ParamDict::set(&pd,5,value);
  ncnn::ParamDict::set(&pd,6,right);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&weights,(ulong)(right != 0),(allocator_type *)&opt);
  if (right != 0) {
    opt.workspace_allocator = (Allocator *)0x4;
    opt.use_winograd_convolution = true;
    opt.use_sgemm_convolution = false;
    opt.use_int8_inference = false;
    opt.use_vulkan_compute = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.use_shader_pack8 = false;
    opt.use_bf16_storage = false;
    opt._36_4_ = 0;
    sVar5 = (size_t)right;
    ptr_1 = (void *)0x0;
    iVar3 = posix_memalign(&ptr_1,0x10,sVar5 * 4 + 4);
    opt._0_8_ = (void *)0x0;
    if (iVar3 == 0) {
      opt._0_8_ = ptr_1;
    }
    opt.blob_allocator = (Allocator *)(opt._0_8_ + sVar5 * 4);
    *(undefined4 *)opt.blob_allocator = 1;
    Randomize((Mat *)&opt,a_00,in_XMM1_Da);
    if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (Mat *)&opt) {
      if (opt.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
        UNLOCK();
      }
      piVar1 = (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (**(code **)(*(long *)(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)
       ((long)&(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount + 4) = 0;
      *(undefined8 *)
       ((long)&(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->elemsize + 4) = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->data = (void *)0x0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->refcount = (int *)0x0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->dims = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->w = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->h = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->c = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->cstep = 0;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->data = (void *)opt._0_8_;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->refcount = (int *)opt.blob_allocator;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->elemsize = (size_t)opt.workspace_allocator;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->elempack = opt._24_4_;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->allocator = (Allocator *)opt._32_8_;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->dims = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->w = right;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->h = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->c = 1;
      (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start)->cstep = sVar5;
    }
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
      UNLOCK();
      if (*(int *)opt.blob_allocator == 0) {
        if (opt._32_8_ == 0) {
          if (opt._0_8_ != 0) {
            free((void *)opt._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)opt._32_8_ + 0x18))();
        }
      }
    }
  }
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar3 = test_layer<ncnn::Padding>
                    ("Padding",&pd,&weights,&opt,&m,0.001,(_func_void_Padding_ptr *)0x0);
  if (iVar3 != 0) {
    fprintf(_stderr,
            "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n"
            ,SUB84((double)value,0),5,7,(ulong)(uint)w,(ulong)(uint)h,(ulong)(uint)c,
            (ulong)(uint)top,(ulong)(uint)bottom,(ulong)(uint)left,(ulong)(uint)right);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&pd.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&pd.params[0].type + lVar4);
        plVar2 = *(long **)((long)&pd.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pd.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (**(code **)(*(long *)m.allocator + 0x18))();
      }
    }
  }
  return iVar3;
}

Assistant:

static int test_padding(int w, int h, int c, int top, int bottom, int left, int right, int type, float value, int per_channel_pad_data_size)
{
    ncnn::Mat a = RandomMat(w, h, c);

    ncnn::ParamDict pd;
    pd.set(0, top);// top
    pd.set(1, bottom);// bottom
    pd.set(2, left);// left
    pd.set(3, right);// right
    pd.set(4, type);// type
    pd.set(5, value);// value
    pd.set(6, per_channel_pad_data_size);// per_channel_pad_data_size

    std::vector<ncnn::Mat> weights(per_channel_pad_data_size ? 1 : 0);
    if (per_channel_pad_data_size)
        weights[0] = RandomMat(per_channel_pad_data_size);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Padding>("Padding", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n", w, h, c, top, bottom, left, right, type, value, per_channel_pad_data_size);
    }

    return ret;
}